

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O0

void __thiscall EDCircles::JoinCircles(EDCircles *this)

{
  int iVar1;
  Circle *pCVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  void *pvVar5;
  void *pvVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined1 local_180 [8];
  EllipseEquation eq;
  double error_1;
  double dStack_138;
  bool ellipseFitOK;
  double error;
  double r;
  double yc;
  double xc;
  int iStack_110;
  bool circleFitOK;
  int noPixelsSave;
  int CandidateArcNo;
  int j_1;
  double *y;
  double *x;
  int noPixels;
  bool EllipseFitValid;
  double EllipseFitError;
  EllipseEquation Eq;
  double dStack_a8;
  bool CircleFitValid;
  double CircleFitError;
  double R;
  double YC;
  double XC;
  double diff2;
  double diff1;
  double centerDistance;
  double dy;
  double dx;
  double dStack_58;
  int j;
  double minorAxisLength;
  double majorAxisLength;
  int i_2;
  int noCandidateCircles;
  int *candidateCircles;
  int i_1;
  bool *taken;
  int i;
  Circle *circles;
  int noCircles;
  EDCircles *this_local;
  
  sortCircle(this->circles2,this->noCircles2);
  iVar1 = this->noCircles2;
  pCVar2 = this->circles2;
  for (taken._4_4_ = 0; taken._4_4_ < iVar1; taken._4_4_ = taken._4_4_ + 1) {
    if ((pCVar2[taken._4_4_].isEllipse & 1U) != 0) {
      ComputeEllipseCenterAndAxisLengths
                (&pCVar2[taken._4_4_].eq,&pCVar2[taken._4_4_].xc,&pCVar2[taken._4_4_].yc,
                 &pCVar2[taken._4_4_].majorAxisLength,&pCVar2[taken._4_4_].minorAxisLength);
    }
  }
  uVar7 = (ulong)iVar1;
  if ((long)uVar7 < 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar7);
  for (candidateCircles._4_4_ = 0; candidateCircles._4_4_ < iVar1;
      candidateCircles._4_4_ = candidateCircles._4_4_ + 1) {
    *(undefined1 *)((long)pvVar5 + (long)candidateCircles._4_4_) = 0;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)iVar1;
  uVar7 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar7 = 0xffffffffffffffff;
  }
  pvVar6 = operator_new__(uVar7);
  for (majorAxisLength._0_4_ = 0; majorAxisLength._0_4_ < iVar1;
      majorAxisLength._0_4_ = majorAxisLength._0_4_ + 1) {
    if ((*(byte *)((long)pvVar5 + (long)majorAxisLength._0_4_) & 1) == 0) {
      if ((pCVar2[majorAxisLength._0_4_].isEllipse & 1U) == 0) {
        minorAxisLength = pCVar2[majorAxisLength._0_4_].r;
        dStack_58 = pCVar2[majorAxisLength._0_4_].r;
      }
      else {
        minorAxisLength = pCVar2[majorAxisLength._0_4_].majorAxisLength;
        dStack_58 = pCVar2[majorAxisLength._0_4_].minorAxisLength;
      }
      majorAxisLength._4_4_ = 0;
      dx._4_4_ = majorAxisLength._0_4_;
      while (dx._4_4_ = dx._4_4_ + 1, dx._4_4_ < iVar1) {
        if (((*(byte *)((long)pvVar5 + (long)dx._4_4_) & 1) == 0) &&
           (dVar8 = pCVar2[majorAxisLength._0_4_].xc - pCVar2[dx._4_4_].xc,
           dVar9 = pCVar2[majorAxisLength._0_4_].yc - pCVar2[dx._4_4_].yc,
           dVar8 = sqrt(dVar8 * dVar8 + dVar9 * dVar9), dVar8 <= 12.0)) {
          if ((pCVar2[dx._4_4_].isEllipse & 1U) == 0) {
            dVar9 = pCVar2[dx._4_4_].r;
            dVar8 = pCVar2[dx._4_4_].r;
          }
          else {
            dVar9 = pCVar2[dx._4_4_].majorAxisLength;
            dVar8 = pCVar2[dx._4_4_].minorAxisLength;
          }
          diff2 = ABS(minorAxisLength - dVar9);
          XC = ABS(dStack_58 - dVar8);
          if ((diff2 <= 6.0) && (XC <= 6.0)) {
            *(int *)((long)pvVar6 + (long)majorAxisLength._4_4_ * 4) = dx._4_4_;
            majorAxisLength._4_4_ = majorAxisLength._4_4_ + 1;
          }
        }
      }
      YC = pCVar2[majorAxisLength._0_4_].xc;
      R = pCVar2[majorAxisLength._0_4_].yc;
      CircleFitError = pCVar2[majorAxisLength._0_4_].r;
      dStack_a8 = pCVar2[majorAxisLength._0_4_].circleFitError;
      Eq.coeff[6]._7_1_ = 0;
      EllipseEquation::EllipseEquation((EllipseEquation *)&EllipseFitError);
      x._7_1_ = 0;
      if (0 < majorAxisLength._4_4_) {
        x._0_4_ = pCVar2[majorAxisLength._0_4_].noPixels;
        y = BufferManager::getX(this->bm);
        _CandidateArcNo = BufferManager::getY(this->bm);
        memcpy(y,pCVar2[majorAxisLength._0_4_].x,(long)(int)x << 3);
        memcpy(_CandidateArcNo,pCVar2[majorAxisLength._0_4_].y,(long)(int)x << 3);
        for (noPixelsSave = 0; noPixelsSave < majorAxisLength._4_4_; noPixelsSave = noPixelsSave + 1
            ) {
          iStack_110 = *(int *)((long)pvVar6 + (long)noPixelsSave * 4);
          xc._4_4_ = (int)x;
          memcpy(y + (int)x,pCVar2[iStack_110].x,(long)pCVar2[iStack_110].noPixels << 3);
          memcpy(_CandidateArcNo + (int)x,pCVar2[iStack_110].y,
                 (long)pCVar2[iStack_110].noPixels << 3);
          x._0_4_ = pCVar2[iStack_110].noPixels + (int)x;
          xc._3_1_ = 0;
          if ((((x._7_1_ & 1) == 0) && ((pCVar2[majorAxisLength._0_4_].isEllipse & 1U) == 0)) &&
             ((pCVar2[iStack_110].isEllipse & 1U) == 0)) {
            dStack_138 = 10000000000.0;
            CircleFit(y,_CandidateArcNo,(int)x,&yc,&r,&error,&stack0xfffffffffffffec8);
            if (dStack_138 <= 2.0) {
              *(undefined1 *)((long)pvVar5 + (long)iStack_110) = 1;
              YC = yc;
              R = r;
              CircleFitError = error;
              dStack_a8 = dStack_138;
              xc._3_1_ = 1;
              Eq.coeff[6]._7_1_ = 1;
            }
          }
          bVar4 = false;
          if ((xc._3_1_ & 1) == 0) {
            eq.coeff[6] = 10000000000.0;
            EllipseEquation::EllipseEquation((EllipseEquation *)local_180);
            bVar4 = EllipseFit(y,_CandidateArcNo,(int)x,(EllipseEquation *)local_180,1);
            if (bVar4) {
              eq.coeff[6] = ComputeEllipseError((EllipseEquation *)local_180,y,_CandidateArcNo,
                                                (int)x);
            }
            bVar4 = eq.coeff[6] <= 2.0;
            if (bVar4) {
              *(undefined1 *)((long)pvVar5 + (long)iStack_110) = 1;
              memcpy(&EllipseFitError,local_180,0x38);
              _noPixels = eq.coeff[6];
              x._7_1_ = 1;
              Eq.coeff[6]._7_1_ = 0;
            }
          }
          if (((xc._3_1_ & 1) == 0) && (!bVar4)) {
            x._0_4_ = xc._4_4_;
          }
        }
      }
      if ((Eq.coeff[6]._7_1_ & 1) == 0) {
        if ((x._7_1_ & 1) == 0) {
          memcpy(this->circles3 + this->noCircles3,pCVar2 + majorAxisLength._0_4_,0x98);
          this->noCircles3 = this->noCircles3 + 1;
        }
        else {
          addCircle(this->circles3,&this->noCircles3,YC,R,CircleFitError,dStack_a8,
                    (EllipseEquation *)&EllipseFitError,_noPixels,(double *)0x0,(double *)0x0,0);
        }
      }
      else {
        addCircle(this->circles3,&this->noCircles3,YC,R,CircleFitError,dStack_a8,(double *)0x0,
                  (double *)0x0,0);
      }
    }
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  if (pvVar6 != (void *)0x0) {
    operator_delete__(pvVar6);
  }
  return;
}

Assistant:

void EDCircles::JoinCircles()
{
	// Sort the circles wrt their radius
	sortCircle(circles2, noCircles2);

	int noCircles = noCircles2;
	Circle *circles = circles2;

	for (int i = 0; i<noCircles; i++) {
		if (circles[i].isEllipse) {
			ComputeEllipseCenterAndAxisLengths(&circles[i].eq, &circles[i].xc, &circles[i].yc, &circles[i].majorAxisLength, &circles[i].minorAxisLength);
		} //end-if
	} //end-for

	bool *taken = new bool[noCircles];
	for (int i = 0; i<noCircles; i++) taken[i] = false;

	int *candidateCircles = new int[noCircles];
	int noCandidateCircles;

	for (int i = 0; i<noCircles; i++) {
		if (taken[i]) continue;

		// Current arc
		double majorAxisLength, minorAxisLength;

		if (circles[i].isEllipse) {
			majorAxisLength = circles[i].majorAxisLength;
			minorAxisLength = circles[i].minorAxisLength;

		}
		else {
			majorAxisLength = circles[i].r;
			minorAxisLength = circles[i].r;
		} //end-else

		  // Find other circles to join with
		noCandidateCircles = 0;

		for (int j = i + 1; j<noCircles; j++) {
			if (taken[j]) continue;

#define JOINED_SHORT_ARC_ERROR_THRESHOLD  2 // 2.5
#define AXIS_LENGTH_DIFF_THRESHOLD     6 //(JOINED_SHORT_ARC_ERROR_THRESHOLD*2+1)
#define CENTER_DISTANCE_THRESHOLD      12 //(AXIS_LENGTH_DIFF_THRESHOLD*2)

			double dx = circles[i].xc - circles[j].xc;
			double dy = circles[i].yc - circles[j].yc;
			double centerDistance = sqrt(dx*dx + dy*dy);
			if (centerDistance > CENTER_DISTANCE_THRESHOLD) continue;

			double diff1, diff2;
			if (circles[j].isEllipse) {
				diff1 = fabs(majorAxisLength - circles[j].majorAxisLength);
				diff2 = fabs(minorAxisLength - circles[j].minorAxisLength);

			}
			else {
				diff1 = fabs(majorAxisLength - circles[j].r);
				diff2 = fabs(minorAxisLength - circles[j].r);
			} //end-else

			if (diff1 > AXIS_LENGTH_DIFF_THRESHOLD) continue;
			if (diff2 > AXIS_LENGTH_DIFF_THRESHOLD) continue;

			// Add to candidates
			candidateCircles[noCandidateCircles] = j;
			noCandidateCircles++;
		} //end-for

		  // Try to join the current arc with the candidate arc (if there is one)
		double XC = circles[i].xc;
		double YC = circles[i].yc;
		double R = circles[i].r;

		double CircleFitError = circles[i].circleFitError;
		bool CircleFitValid = false;

		EllipseEquation Eq;
		double EllipseFitError;
		bool EllipseFitValid = false;

		if (noCandidateCircles > 0) {
			int noPixels = circles[i].noPixels;
			double *x = bm->getX();
			double *y = bm->getY();
			memcpy(x, circles[i].x, noPixels * sizeof(double));
			memcpy(y, circles[i].y, noPixels * sizeof(double));

			for (int j = 0; j<noCandidateCircles; j++) {
				int CandidateArcNo = candidateCircles[j];

				int noPixelsSave = noPixels;
				memcpy(x + noPixels, circles[CandidateArcNo].x, circles[CandidateArcNo].noPixels * sizeof(double));
				memcpy(y + noPixels, circles[CandidateArcNo].y, circles[CandidateArcNo].noPixels * sizeof(double));
				noPixels += circles[CandidateArcNo].noPixels;

				bool circleFitOK = false;
				if (EllipseFitValid == false && circles[i].isEllipse == false && circles[CandidateArcNo].isEllipse == false) {
					double xc, yc, r, error = 1e10;
					CircleFit(x, y, noPixels, &xc, &yc, &r, &error);

					if (error <= JOINED_SHORT_ARC_ERROR_THRESHOLD) {
						taken[CandidateArcNo] = true;

						XC = xc;
						YC = yc;
						R = r;
						CircleFitError = error;

						circleFitOK = true;
						CircleFitValid = true;
					} //end-if
				} // end-if

				bool ellipseFitOK = false;
				if (circleFitOK == false) {
					// Try to fit an ellipse
					double error = 1e10;
					EllipseEquation eq;
					if (EllipseFit(x, y, noPixels, &eq)) {
						error = ComputeEllipseError(&eq, x, y, noPixels);
					} //end-if

					if (error <= JOINED_SHORT_ARC_ERROR_THRESHOLD) {
						taken[CandidateArcNo] = true;

						Eq = eq;
						EllipseFitError = error;

						ellipseFitOK = true;
						EllipseFitValid = true;
						CircleFitValid = false;
					} // end-if
				} //end-if

				if (circleFitOK == false && ellipseFitOK == false) {
					noPixels = noPixelsSave;
				} //end-if
			} // end-for
		} //end-if

		// Add the new circle/ellipse to circles2
		if (CircleFitValid) {
			addCircle(circles3, noCircles3, XC, YC, R, CircleFitError, NULL, NULL, 0);

		}
		else if (EllipseFitValid) {
			addCircle(circles3, noCircles3, XC, YC, R, CircleFitError, &Eq, EllipseFitError, NULL, NULL, 0);

		}
		else {
			circles3[noCircles3] = circles[i];
			noCircles3++;
		} //end-else
	} //end-for

	delete[] taken;
	delete[] candidateCircles;
}